

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
TagVisitor<IDLSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
::Accept(TagVisitor<IDLSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
         *this,cmSourceFile *sf)

{
  cmGlobalGenerator *this_00;
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  string *s;
  cmCustomCommand *pcVar5;
  char *pcVar6;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  undefined1 local_38 [8];
  string ext;
  cmSourceFile *sf_local;
  TagVisitor<IDLSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  *this_local;
  
  ext.field_2._8_8_ = sf;
  s = cmSourceFile::GetExtension_abi_cxx11_(sf);
  cmsys::SystemTools::LowerCase((string *)local_38,s);
  pcVar5 = cmSourceFile::GetCustomCommand((cmSourceFile *)ext.field_2._8_8_);
  if (pcVar5 == (cmCustomCommand *)0x0) {
    TVar4 = cmTarget::GetType(this->Target);
    uVar1 = ext.field_2._8_8_;
    if (TVar4 == UTILITY) {
      DoAccept<false>::Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                (this->Data,(cmSourceFile *)ext.field_2._8_8_);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"HEADER_FILE_ONLY",&local_69);
      bVar2 = cmSourceFile::GetPropertyAsBool((cmSourceFile *)uVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      uVar1 = ext.field_2._8_8_;
      if (bVar2) {
        DoAccept<false>::Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                  (this->Data,(cmSourceFile *)ext.field_2._8_8_);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,"EXTERNAL_OBJECT",&local_91);
        bVar2 = cmSourceFile::GetPropertyAsBool((cmSourceFile *)uVar1,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if (bVar2) {
          DoAccept<false>::Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                    (this->Data,(cmSourceFile *)ext.field_2._8_8_);
          if ((this->IsObjLib & 1U) != 0) {
            std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                      (&this->BadObjLibFiles,(value_type *)((long)&ext.field_2 + 8));
          }
        }
        else {
          cmSourceFile::GetLanguage_abi_cxx11_(&local_b8,(cmSourceFile *)ext.field_2._8_8_);
          bVar3 = std::__cxx11::string::empty();
          std::__cxx11::string::~string((string *)&local_b8);
          if (((bVar3 ^ 0xff) & 1) == 0) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_38,"def");
            if (bVar2) {
              DoAccept<false>::
              Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                        (this->Data,(cmSourceFile *)ext.field_2._8_8_);
              if ((this->IsObjLib & 1U) != 0) {
                std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                          (&this->BadObjLibFiles,(value_type *)((long)&ext.field_2 + 8));
              }
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_38,"idl");
              if (bVar2) {
                DoAccept<true>::Do(this->Data,(cmSourceFile *)ext.field_2._8_8_);
                if ((this->IsObjLib & 1U) != 0) {
                  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                            (&this->BadObjLibFiles,(value_type *)((long)&ext.field_2 + 8));
                }
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_38,"resx");
                if (bVar2) {
                  DoAccept<false>::
                  Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                            (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_38,"appxmanifest");
                  if (bVar2) {
                    DoAccept<false>::
                    Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                              (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_38,"pfx");
                    if (bVar2) {
                      DoAccept<false>::
                      Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                                (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_38,"xaml");
                      if (bVar2) {
                        DoAccept<false>::
                        Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                                  (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                      }
                      else {
                        cmSourceFile::GetFullPath((cmSourceFile *)ext.field_2._8_8_,(string *)0x0);
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        bVar2 = cmsys::RegularExpression::find(&this->Header,pcVar6);
                        if (bVar2) {
                          DoAccept<false>::
                          Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                                    (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                        }
                        else {
                          this_00 = this->GlobalGenerator;
                          cmSourceFile::GetExtension_abi_cxx11_((cmSourceFile *)ext.field_2._8_8_);
                          pcVar6 = (char *)std::__cxx11::string::c_str();
                          bVar2 = cmGlobalGenerator::IgnoreFile(this_00,pcVar6);
                          if (bVar2) {
                            DoAccept<false>::
                            Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                                      (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                          }
                          else {
                            DoAccept<false>::
                            Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                                      (this->Data,(cmSourceFile *)ext.field_2._8_8_);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            DoAccept<false>::
            Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                      (this->Data,(cmSourceFile *)ext.field_2._8_8_);
          }
        }
      }
    }
  }
  else {
    DoAccept<false>::Do<std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              (this->Data,(cmSourceFile *)ext.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Accept(cmSourceFile *sf)
  {
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if(sf->GetCustomCommand())
      {
      DoAccept<IsSameTag<Tag, CustomCommandsTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Target->GetType() == cmTarget::UTILITY)
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("HEADER_FILE_ONLY"))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(sf->GetPropertyAsBool("EXTERNAL_OBJECT"))
      {
      DoAccept<IsSameTag<Tag, ExternalObjectsTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(!sf->GetLanguage().empty())
      {
      DoAccept<IsSameTag<Tag, ObjectSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(ext == "def")
      {
      DoAccept<IsSameTag<Tag, ModuleDefinitionFileTag>::Result>::Do(this->Data,
                                                                    sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "idl")
      {
      DoAccept<IsSameTag<Tag, IDLSourcesTag>::Result>::Do(this->Data, sf);
      if(this->IsObjLib)
        {
        this->BadObjLibFiles.push_back(sf);
        }
      }
    else if(ext == "resx")
      {
      DoAccept<IsSameTag<Tag, ResxTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "appxmanifest")
      {
      DoAccept<IsSameTag<Tag, AppManifestTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "pfx")
      {
      DoAccept<IsSameTag<Tag, CertificatesTag>::Result>::Do(this->Data, sf);
      }
    else if (ext == "xaml")
      {
      DoAccept<IsSameTag<Tag, XamlTag>::Result>::Do(this->Data, sf);
      }
    else if(this->Header.find(sf->GetFullPath().c_str()))
      {
      DoAccept<IsSameTag<Tag, HeaderSourcesTag>::Result>::Do(this->Data, sf);
      }
    else if(this->GlobalGenerator->IgnoreFile(sf->GetExtension().c_str()))
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
    else
      {
      DoAccept<IsSameTag<Tag, ExtraSourcesTag>::Result>::Do(this->Data, sf);
      }
  }